

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void sendsuboption(connectdata *conn,int option)

{
  Curl_easy *data_00;
  void *pvVar1;
  undefined1 *puVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ssize_t sVar5;
  uint *puVar6;
  TELNET *tn;
  Curl_easy *data;
  uchar *uc2;
  uchar *uc1;
  unsigned_short y;
  unsigned_short x;
  int err;
  ssize_t bytes_written;
  int option_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  if (option == 0x1f) {
    *(long *)((long)pvVar1 + 0x1eb8) = (long)pvVar1 + 0x1cb8;
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = 0xff;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = 0xfa;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = 0x1f;
    }
    uVar3 = htons(*(uint16_t *)((long)pvVar1 + 0x1ca8));
    uVar4 = htons(*(uint16_t *)((long)pvVar1 + 0x1caa));
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      uc1._2_1_ = (undefined1)uVar3;
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = uc1._2_1_;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      uc1._3_1_ = (undefined1)(uVar3 >> 8);
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = uc1._3_1_;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      uc1._0_1_ = (undefined1)uVar4;
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = uc1._0_1_;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      uc1._1_1_ = (undefined1)(uVar4 >> 8);
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = uc1._1_1_;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = 0xff;
    }
    if (*(ulong *)((long)pvVar1 + 0x1eb8) < (long)pvVar1 + 0x1eb8U) {
      puVar2 = *(undefined1 **)((long)pvVar1 + 0x1eb8);
      *(undefined1 **)((long)pvVar1 + 0x1eb8) = puVar2 + 1;
      *puVar2 = 0xf0;
    }
    *(undefined8 *)((long)pvVar1 + 0x1ec0) = *(undefined8 *)((long)pvVar1 + 0x1eb8);
    *(long *)((long)pvVar1 + 0x1eb8) = (long)pvVar1 + 0x1cb8;
    printsub(data_00,0x3e,(uchar *)((long)pvVar1 + 0x1cba),
             (*(long *)((long)pvVar1 + 0x1ec0) - *(long *)((long)pvVar1 + 0x1eb8)) - 2);
    sVar5 = send(conn->sock[0],(void *)((long)pvVar1 + 0x1cb8),3,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
    send_telnet_data(conn,(char *)((long)pvVar1 + 0x1cbb),4);
    sVar5 = send(conn->sock[0],(void *)((long)pvVar1 + 0x1cbf),2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;

  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->req.protop;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}